

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcEco.c
# Opt level: O2

int Bmc_EcoPatch(Gia_Man_t *p,int nIns,int nOuts)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pAig;
  Cnf_Dat_t *pCVar4;
  sat_solver *s;
  Gia_Obj_t *pGVar5;
  Vec_Int_t *vVars;
  long lVar6;
  undefined4 in_register_00000034;
  int Lit;
  undefined8 local_40;
  sat_solver *local_38;
  
  local_40 = CONCAT44(in_register_00000034,nIns);
  pAig = Gia_ManToAigSimple(p);
  pAig->nRegs = 0;
  pCVar4 = Cnf_Derive(pAig,pAig->nObjs[3]);
  Aig_ManStop(pAig);
  s = sat_solver_new();
  sat_solver_setnvars(s,pCVar4->nVars);
  lVar6 = 0;
  while (lVar6 < pCVar4->nClauses) {
    iVar2 = sat_solver_addclause(s,pCVar4->pClauses[lVar6],pCVar4->pClauses[lVar6 + 1]);
    lVar6 = lVar6 + 1;
    if (iVar2 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xd6,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
    }
  }
  if (p->vCos->nSize - p->nRegs != (int)local_40 + nOuts + 1) {
    __assert_fail("Gia_ManPoNum(p) == nOuts + 1 + nIns",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0xd8,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
  }
  iVar2 = 0;
  while (iVar2 < p->vCos->nSize - p->nRegs) {
    pGVar5 = Gia_ManCo(p,iVar2);
    if ((nOuts == iVar2) || (pGVar5 == (Gia_Obj_t *)0x0)) break;
    piVar1 = pCVar4->pVarNums;
    iVar3 = Gia_ObjId(p,pGVar5);
    Lit = Abc_Var2Lit(piVar1[iVar3],1);
    iVar3 = sat_solver_addclause(s,&Lit,(lit *)&local_40);
    iVar2 = iVar2 + 1;
    if (iVar3 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                    ,0xdf,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
    }
  }
  pGVar5 = Gia_ManPo(p,nOuts);
  piVar1 = pCVar4->pVarNums;
  iVar2 = Gia_ObjId(p,pGVar5);
  Lit = Abc_Var2Lit(piVar1[iVar2],0);
  iVar2 = sat_solver_addclause(s,&Lit,(lit *)&local_40);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0xe5,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
  }
  iVar2 = sat_solver_simplify(s);
  if (iVar2 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                  ,0xe8,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
  }
  vVars = Vec_IntAlloc((int)local_40);
  local_38 = s;
  for (iVar2 = 0; iVar2 < p->vCos->nSize - p->nRegs; iVar2 = iVar2 + 1) {
    pGVar5 = Gia_ManCo(p,iVar2);
    if (pGVar5 == (Gia_Obj_t *)0x0) break;
    if (nOuts < iVar2) {
      piVar1 = pCVar4->pVarNums;
      iVar3 = Gia_ObjId(p,pGVar5);
      s = local_38;
      Vec_IntPush(vVars,piVar1[iVar3]);
    }
  }
  if (vVars->nSize == (int)local_40) {
    pGVar5 = Gia_ManCi(p,~p->nRegs + p->vCis->nSize);
    piVar1 = pCVar4->pVarNums;
    iVar2 = Gia_ObjId(p,pGVar5);
    iVar2 = Bmc_EcoSolve(s,piVar1[iVar2],vVars);
    Vec_IntFree(vVars);
    return iVar2;
  }
  __assert_fail("Vec_IntSize(vVars) == nIns",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bmc/bmcEco.c"
                ,0xee,"int Bmc_EcoPatch(Gia_Man_t *, int, int)");
}

Assistant:

int Bmc_EcoPatch( Gia_Man_t * p, int nIns, int nOuts )
{
    int i, Lit, RetValue, Root;
    Gia_Obj_t * pObj;
    Vec_Int_t * vVars;
    // generate CNF and solver
    Cnf_Dat_t * pCnf = Cnf_DeriveGiaRemapped( p );
    sat_solver * pSat = sat_solver_new();
    sat_solver_setnvars( pSat, pCnf->nVars );
    // add timeframe clauses
    for ( i = 0; i < pCnf->nClauses; i++ )
        if ( !sat_solver_addclause( pSat, pCnf->pClauses[i], pCnf->pClauses[i+1] ) )
            assert( 0 );
    // add equality constraints
    assert( Gia_ManPoNum(p) == nOuts + 1 + nIns );
    Gia_ManForEachPo( p, pObj, i )
    {
        if ( i == nOuts )
            break;
        Lit = Abc_Var2Lit( pCnf->pVarNums[Gia_ObjId(p, pObj)], 1 ); // neg lit
        RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
        assert( RetValue );
    }
    // add inequality constraint
    pObj = Gia_ManPo( p, nOuts );
    Lit = Abc_Var2Lit( pCnf->pVarNums[Gia_ObjId(p, pObj)], 0 ); // pos lit
    RetValue = sat_solver_addclause( pSat, &Lit, &Lit + 1 );
    assert( RetValue );
    // simplify the SAT solver
    RetValue = sat_solver_simplify( pSat );
    assert( RetValue );
    // collect input variables
    vVars = Vec_IntAlloc( nIns );
    Gia_ManForEachPo( p, pObj, i )
        if ( i >= nOuts + 1 )
            Vec_IntPush( vVars, pCnf->pVarNums[Gia_ObjId(p, pObj)] );
    assert( Vec_IntSize(vVars) == nIns );
    // derive the root variable
    pObj = Gia_ManPi( p, Gia_ManPiNum(p) - 1 );
    Root = pCnf->pVarNums[Gia_ObjId(p, pObj)];
    // solve the problem
    RetValue = Bmc_EcoSolve( pSat, Root, vVars );
    Vec_IntFree( vVars );
    return RetValue;
}